

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::EpochUsFun::GetFunctions(void)

{
  scalar_function_t timetz_func;
  duckdb *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  function_statistics_t ts_stats;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  scalar_function_t local_258;
  scalar_function_t local_238;
  LogicalType local_218 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_200;
  code *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  scalar_function_t local_1c8;
  scalar_function_t local_1a8;
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  ScalarFunction local_158;
  
  ts_stats = (function_statistics_t)0x5b535d;
  duckdb::LogicalType::LogicalType(local_170,BIGINT);
  local_258.super__Function_base._M_functor._8_8_ = 0;
  local_258.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_258._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_258.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_238.super__Function_base._M_functor._8_8_ = 0;
  local_238.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMicrosecondsOperator>
  ;
  local_238._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_238.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_1a8.super__Function_base._M_functor._8_8_ = 0;
  local_1a8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::
       UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_1a8._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_1a8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_1c8.super__Function_base._M_functor._8_8_ = 0;
  local_1c8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::
       UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_1c8._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_1c8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_1e0 = 0;
  local_1e8 = ScalarFunction::
              UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_1d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = &local_1e8;
  timetz_func.super__Function_base._M_manager =
       DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker = DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::dtime_t>
  ;
  GetGenericTimePartFunction
            (in_RDI,local_170,&local_258,&local_238,&local_1a8,&local_1c8,timetz_func,
             DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::dtime_tz_t>,ts_stats,
             (function_statistics_t)in_stack_fffffffffffffd88,
             (function_statistics_t)in_stack_fffffffffffffd90);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,3);
  }
  if (local_1c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1c8.super__Function_base._M_manager)
              ((_Any_data *)&local_1c8,(_Any_data *)&local_1c8,__destroy_functor);
  }
  if (local_1a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1a8.super__Function_base._M_manager)
              ((_Any_data *)&local_1a8,(_Any_data *)&local_1a8,__destroy_functor);
  }
  if (local_238.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_238.super__Function_base._M_manager)
              ((_Any_data *)&local_238,(_Any_data *)&local_238,__destroy_functor);
  }
  if (local_258.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_258.super__Function_base._M_manager)
              ((_Any_data *)&local_258,(_Any_data *)&local_258,__destroy_functor);
  }
  duckdb::LogicalType::~LogicalType(local_170);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_258,TIMESTAMP_TZ);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_258;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_200,__l,(allocator_type *)&local_238);
  duckdb::LogicalType::LogicalType(local_218,BIGINT);
  duckdb::LogicalType::LogicalType(local_188,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_200,local_218,&stack0xfffffffffffffd88,0,0,
             DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::timestamp_t>,0,
             local_188,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_158 + 0xb0U),(_Any_data *)((long)&local_158 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_188);
  std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffd88,(_Any_data *)&stack0xfffffffffffffd88,
               __destroy_functor);
  duckdb::LogicalType::~LogicalType(local_218);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_200);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_258);
  return;
}

Assistant:

ScalarFunctionSet EpochUsFun::GetFunctions() {
	using OP = DatePart::EpochMicrosecondsOperator;
	auto operator_set = GetTimePartFunction<OP>();

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, int64_t, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));
	return operator_set;
}